

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOfPlaceHolder
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QString *objectName)

{
  QDockAreaLayoutItem *pQVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QStringView QVar11;
  QStringView QVar12;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar10 = (this->item_list).d.size != 0;
  if (bVar10) {
    lVar9 = 8;
    uVar8 = 0;
    do {
      pQVar1 = (this->item_list).d.ptr;
      if (*(long *)((long)&pQVar1->widgetItem + lVar9) == 0) {
        lVar2 = *(long *)((long)&pQVar1->subinfo + lVar9);
        bVar6 = false;
        if (lVar2 != 0) {
          lVar3 = (objectName->d).size;
          if ((*(long *)(lVar2 + 0x10) == lVar3) &&
             (QVar11.m_data = *(storage_type_conflict **)(lVar2 + 8),
             QVar11.m_size = *(long *)(lVar2 + 0x10), QVar12.m_data = (objectName->d).ptr,
             QVar12.m_size = lVar3, cVar7 = QtPrivate::equalStrings(QVar11,QVar12), cVar7 != '\0'))
          {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (int *)0x0;
            (__return_storage_ptr__->d).size = 0;
            local_3c = (int)uVar8;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                       &local_3c);
            QList<int>::end(__return_storage_ptr__);
            bVar6 = true;
          }
        }
      }
      else {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        indexOfPlaceHolder(__return_storage_ptr__,
                           *(QDockAreaLayoutInfo **)((long)&pQVar1->widgetItem + lVar9),objectName);
        if ((__return_storage_ptr__->d).size == 0) {
          bVar6 = false;
          pDVar5 = (__return_storage_ptr__->d).d;
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
            }
          }
        }
        else {
          local_3c = (int)uVar8;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
          bVar6 = true;
        }
      }
      if (bVar6) {
        if (bVar10) goto LAB_003f9484;
        break;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x28;
      uVar4 = (this->item_list).d.size;
      bVar10 = uVar8 < uVar4;
    } while (uVar8 < uVar4);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_003f9484:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOfPlaceHolder(objectName);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (item.placeHolderItem != nullptr && item.placeHolderItem->objectName == objectName) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}